

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  undefined8 *puVar1;
  bool bVar2;
  PromiseNode *pPVar3;
  NullableValue<kj::Exception> *other;
  Exception *pEVar4;
  PromiseFulfiller<void> *pPVar5;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *other_00;
  anon_class_8_1_8991fb9c *func;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar6;
  Own<kj::_::Event,_std::nullptr_t> local_560;
  Exception *local_550;
  Exception *e;
  Exception *_e344;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_538;
  undefined1 local_522 [2];
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_520;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f336;
  OwnTask self;
  Exception *exception;
  Maybe<kj::Exception> local_4f8;
  undefined1 local_360 [8];
  NullableValue<kj::Exception> _exception326;
  undefined1 local_1b8 [8];
  ExceptionOr<kj::_::Void> result;
  Task *this_local;
  
  kj::_::ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)local_1b8);
  pPVar3 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->
                     ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0x68));
  (*(pPVar3->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])(pPVar3,local_1b8);
  runCatchingExceptions<kj::TaskSet::Task::fire()::_lambda()_1_>(&local_4f8,(kj *)&exception,func);
  other = kj::_::readMaybe<kj::Exception>(&local_4f8);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_360,other);
  Maybe<kj::Exception>::~Maybe(&local_4f8);
  pEVar4 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_360);
  if (pEVar4 != (Exception *)0x0) {
    self.ptr = (Task *)kj::_::NullableValue<kj::Exception>::operator*
                                 ((NullableValue<kj::Exception> *)local_360);
    pEVar4 = mv<kj::Exception>((Exception *)self.ptr);
    kj::_::ExceptionOrValue::addException((ExceptionOrValue *)local_1b8,pEVar4);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_360);
  pop((Task *)&_f336);
  f = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                 (*(long *)(in_RSI + 0x60) + 0x10));
  if ((f != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) &&
     (local_520 = f,
     bVar2 = Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::operator==
                       ((Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)
                        (*(long *)(in_RSI + 0x60) + 8)), bVar2)) {
    pPVar5 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_520);
    (*(pPVar5->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar5,local_522);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
               (*(long *)(in_RSI + 0x60) + 0x10),&local_538);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_538);
  }
  e = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
  if (e != (Exception *)0x0) {
    puVar1 = (undefined8 *)**(undefined8 **)(in_RSI + 0x60);
    local_550 = e;
    pEVar4 = mv<kj::Exception>(e);
    (**(code **)*puVar1)(puVar1,pEVar4);
  }
  other_00 = mv<kj::Own<kj::TaskSet::Task,kj::_::PromiseDisposer>>
                       ((Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&_f336);
  Own<kj::_::Event,decltype(nullptr)>::Own<kj::TaskSet::Task,kj::_::PromiseDisposer,void>
            ((Own<kj::_::Event,decltype(nullptr)> *)&local_560,other_00);
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this,&local_560);
  Own<kj::_::Event,_std::nullptr_t>::~Own(&local_560);
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::~Own
            ((Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&_f336);
  kj::_::ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)local_1b8);
  MVar6.ptr.ptr = extraout_RDX;
  MVar6.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar6.ptr;
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(exception));
    }

    // Remove from the task list. Do this before calling taskFailed(), so that taskFailed() can
    // safely call clear().
    auto self = pop();

    // We'll also process onEmpty() now, just in case `taskFailed()` actually destroys the whole
    // `TaskSet`.
    KJ_IF_SOME(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == kj::none) {
        f->fulfill();
        taskSet.emptyFulfiller = kj::none;
      }
    }

    // Call the error handler if there was an exception.
    KJ_IF_SOME(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(e));
    }

    return Own<Event>(mv(self));
  }